

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExternalFunction.cpp
# Opt level: O1

Var Js::JavascriptExternalFunction::HandleRecordReplayExternalFunction_StdThunk
              (RecyclableObject *function,CallInfo *callInfo,Arguments *args,
              ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *pTVar2;
  EventLog *this;
  ThreadContext *pTVar3;
  EventLogEntry *evt;
  int rootDepth;
  uint uVar4;
  void *__frameAddr;
  undefined1 local_90 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  StdCallJavascriptMethodInfo info;
  Var local_38;
  Var result;
  
  local_38 = (Var)0x0;
  if (scriptContext->TTDShouldPerformReplayAction == true) {
    pTVar2 = scriptContext->threadContext;
    pTVar2->TTDRootNestingCount = pTVar2->TTDRootNestingCount + 1;
    TTD::EventLog::ReplayExternalCallEvent
              (pTVar2->TTDLog,(JavascriptFunction *)function,args,&local_38);
  }
  else {
    if ((args->Info).field_0x2 != '\0') {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec52,(PCWSTR)0x0);
    }
    if (scriptContext->TTDShouldPerformRecordAction == false) {
      TTDAbort_unrecoverable_error("Check either record/replay before calling!!!");
    }
    pTVar2 = scriptContext->threadContext;
    this = pTVar2->TTDLog;
    rootDepth = pTVar2->TTDRootNestingCount + 1;
    pTVar2->TTDRootNestingCount = rootDepth;
    evt = TTD::EventLog::RecordExternalCallEvent
                    (this,(JavascriptFunction *)function,rootDepth,args,true);
    __leaveScriptObject._32_8_ = Arguments::operator[](args,0);
    uVar4 = SUB84(args->Info,0);
    if ((uVar4 >> 0x1e & 1) != 0) {
      CallInfo::GetNewTarget
                (SUB84(args->Info,3) &
                 (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed|
                  CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),args->Values,
                 uVar4 & 0xffffff);
    }
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_90,scriptContext,
               &stack0xfffffffffffffff8);
    pTVar3 = scriptContext->threadContext;
    bVar1 = pTVar3->reentrancySafeOrHandled;
    pTVar3->reentrancySafeOrHandled = true;
    local_38 = (Var)(*(code *)function[5].type.ptr)
                              (function,args->Values,*(undefined2 *)&args->Info,
                               &__leaveScriptObject.__exceptionCheck,
                               function[5].super_FinalizableObject.super_IRecyclerVisitedObject.
                               _vptr_IRecyclerVisitedObject);
    ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
    pTVar3->reentrancySafeOrHandled = bVar1;
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_90);
    TTD::EventLog::RecordExternalCallEvent_Complete
              (this,(JavascriptFunction *)function,evt,local_38);
  }
  pTVar2->TTDRootNestingCount = pTVar2->TTDRootNestingCount + -1;
  return local_38;
}

Assistant:

Var JavascriptExternalFunction::HandleRecordReplayExternalFunction_StdThunk(Js::RecyclableObject* function, CallInfo& callInfo, Arguments& args, ScriptContext* scriptContext)
    {
        JavascriptExternalFunction* externalFunction = static_cast<JavascriptExternalFunction*>(function);

        Var result = nullptr;

        if(scriptContext->ShouldPerformReplayAction())
        {
            TTD::TTDNestingDepthAutoAdjuster logPopper(scriptContext->GetThreadContext());
            scriptContext->GetThreadContext()->TTDLog->ReplayExternalCallEvent(externalFunction, args, &result);
        }
        else
        {
            if (args.Info.Count > USHORT_MAX)
            {
                // Due to compat reasons, stdcall external functions expect a ushort count of args.
                // To support more than this we will need a new API.
                Js::JavascriptError::ThrowTypeError(scriptContext, JSERR_ArgListTooLarge);
            }

            TTDAssert(scriptContext->ShouldPerformRecordAction(), "Check either record/replay before calling!!!");

            TTD::EventLog* elog = scriptContext->GetThreadContext()->TTDLog;

            TTD::TTDNestingDepthAutoAdjuster logPopper(scriptContext->GetThreadContext());
            TTD::NSLogEvents::EventLogEntry* callEvent = elog->RecordExternalCallEvent(externalFunction, scriptContext->GetThreadContext()->TTDRootNestingCount, args, true);

            StdCallJavascriptMethodInfo info = {
                args[0],
                args.HasNewTarget() ? args.GetNewTarget() : args.IsNewCall() ? function : scriptContext->GetLibrary()->GetUndefined(),
                args.IsNewCall()
            };

            BEGIN_LEAVE_SCRIPT(scriptContext)
            {
                result = externalFunction->stdCallNativeMethod(function, args.Values, static_cast<ushort>(args.Info.Count), &info, externalFunction->callbackState);
            }
            END_LEAVE_SCRIPT(scriptContext);

            elog->RecordExternalCallEvent_Complete(externalFunction, callEvent, result);
        }

        return result;
    }